

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.c
# Opt level: O1

int convolution_segment_start(mixed_segment *segment)

{
  long *plVar1;
  int iVar2;
  
  plVar1 = (long *)segment->data;
  if ((plVar1[1] == 0) || (*plVar1 == 0)) {
    mixed_err(0x16);
    iVar2 = 0;
  }
  else {
    *(undefined4 *)(plVar1 + 0xe) = 0;
    memset((void *)plVar1[0x10],0,
           (ulong)*(uint *)((long)plVar1 + 0x6c) * (ulong)*(uint *)(plVar1 + 0xd) * 4);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int convolution_segment_start(struct mixed_segment *segment){
  struct convolution_segment_data *data = (struct convolution_segment_data *)segment->data;
  if(data->out == 0 || data->in == 0){
    mixed_err(MIXED_BUFFER_MISSING);
    return 0;
  }
  data->block_idx = 0;
  memset(data->buf, 0, sizeof(float)*data->block_count*data->block_size);
  return 1;
}